

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O3

void __thiscall
QTextOdfWriter::tableCellStyleElement
          (QTextOdfWriter *this,QXmlStreamWriter *writer,int *formatIndex,
          QTextTableCellFormat *format,bool hasBorder,int tableId,QTextTableFormat *tableFormatTmp)

{
  ulong uVar1;
  ulong uVar2;
  qreal qVar3;
  qreal qVar4;
  double pixels;
  Data *pDVar5;
  qsizetype qVar6;
  bool bVar7;
  int iVar8;
  char16_t *pcVar9;
  storage_type *psVar10;
  size_t sVar11;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar12;
  char16_t *pcVar13;
  longlong __old_val;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QAnyStringView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QAnyStringView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QAnyStringView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QAnyStringView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QAnyStringView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QAnyStringView QVar33;
  QByteArrayView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QAnyStringView QVar37;
  QByteArrayView QVar38;
  QAnyStringView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QAnyStringView QVar42;
  QAnyStringView QVar43;
  QAnyStringView QVar44;
  QAnyStringView QVar45;
  QAnyStringView QVar46;
  QAnyStringView QVar47;
  QAnyStringView QVar48;
  QAnyStringView QVar49;
  QAnyStringView QVar50;
  QAnyStringView QVar51;
  QAnyStringView QVar52;
  QAnyStringView QVar53;
  QAnyStringView QVar54;
  QAnyStringView QVar55;
  QAnyStringView QVar56;
  QAnyStringView QVar57;
  QAnyStringView QVar58;
  QAnyStringView QVar59;
  QAnyStringView QVar60;
  QAnyStringView QVar61;
  QAnyStringView QVar62;
  wrapped_t<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>,_QString>
  local_208;
  undefined1 local_1f0 [8];
  QString local_1e8;
  QArrayData *local_1c8;
  char16_t *pcStack_1c0;
  qsizetype local_1b8;
  QString local_1a8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> local_188;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> local_148;
  qsizetype local_108;
  char *pcStack_100;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  local_f8;
  QAnyStringView local_90;
  char16_t *local_80;
  ulong uStack_78;
  char16_t *local_70;
  ulong uStack_68;
  QArrayData *local_60;
  size_t local_58;
  ulong local_50;
  char16_t *local_48;
  ulong uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar9 = (this->styleNS).d.ptr;
  uVar1 = (this->styleNS).d.size;
  QVar15.m_data = &DAT_00000005;
  QVar15.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar15);
  QVar16.m_size = (size_t)pcVar9;
  QVar16.field_0.m_data_utf8 = (char *)writer;
  QVar43.m_size = (size_t)local_f8.a.a.a.a.d.ptr;
  QVar43.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar16,QVar43);
  if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar9 = (this->styleNS).d.ptr;
  aVar12.m_data = (void *)((this->styleNS).d.size | 0x8000000000000000);
  if (hasBorder) {
    QVar17.m_data = (storage_type *)0x4;
    QVar17.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar17);
    pcVar13 = local_f8.a.a.a.a.d.ptr;
    aVar14.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
    QVar18.m_data = (storage_type *)0x7;
    QVar18.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar18);
    QString::arg_impl((longlong)&local_188,(int)&local_60,tableId,(QChar)0x0);
    sVar11 = 0x20;
    QString::arg_impl((longlong)&local_148,(int)&local_188,*formatIndex,(QChar)0x0);
    local_48 = local_148.a.a.d.ptr;
    uStack_40 = local_148.a.a.d.size | 0x8000000000000000;
    QVar19.m_size = (size_t)pcVar9;
    QVar19.field_0.m_data_utf8 = (char *)writer;
    QVar44.m_size = (size_t)pcVar13;
    QVar44.field_0.m_data = aVar12.m_data;
    QVar54.m_size = sVar11;
    QVar54.field_0.m_data = aVar14.m_data;
    QXmlStreamWriter::writeAttribute(QVar19,QVar44,QVar54);
    if (&(local_148.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_148.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_188.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_188.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_60 != (QArrayData *)0x0) {
      LOCK();
      (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60,2,0x10);
      }
    }
  }
  else {
    QVar20.m_data = (storage_type *)0x4;
    QVar20.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar20);
    pcVar13 = local_f8.a.a.a.a.d.ptr;
    aVar14.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
    QVar21.m_data = (storage_type *)0x3;
    QVar21.m_size = (qsizetype)&local_188;
    QString::fromLatin1(QVar21);
    sVar11 = 0x20;
    QString::arg_impl((longlong)&local_148,(int)&local_188,*formatIndex,(QChar)0x0);
    local_70 = local_148.a.a.d.ptr;
    uStack_68 = local_148.a.a.d.size | 0x8000000000000000;
    QVar22.m_size = (size_t)pcVar9;
    QVar22.field_0.m_data_utf8 = (char *)writer;
    QVar45.m_size = (size_t)pcVar13;
    QVar45.field_0.m_data = aVar12.m_data;
    QVar55.m_size = sVar11;
    QVar55.field_0.m_data = aVar14.m_data;
    QXmlStreamWriter::writeAttribute(QVar22,QVar45,QVar55);
    if (&(local_148.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_148.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_188.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_188.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar9 = (this->styleNS).d.ptr;
  uVar1 = (this->styleNS).d.size;
  QVar23.m_data = &DAT_00000006;
  QVar23.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar23);
  pcVar13 = local_f8.a.a.a.a.d.ptr;
  aVar12.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
  QVar24.m_data = (storage_type *)0xa;
  QVar24.m_size = (qsizetype)&local_148;
  QString::fromLatin1(QVar24);
  local_80 = local_148.a.a.d.ptr;
  uStack_78 = local_148.a.a.d.size | 0x8000000000000000;
  QVar25.m_size = (size_t)pcVar9;
  QVar25.field_0.m_data_utf8 = (char *)writer;
  QVar46.m_size = (size_t)pcVar13;
  QVar46.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar56.m_size = sVar11;
  QVar56.field_0.m_data = aVar12.m_data;
  QXmlStreamWriter::writeAttribute(QVar25,QVar46,QVar56);
  if (&(local_148.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar9 = (this->styleNS).d.ptr;
  uVar1 = (this->styleNS).d.size;
  QVar26.m_data = (storage_type *)0x15;
  QVar26.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar26);
  QVar27.m_size = (size_t)pcVar9;
  QVar27.field_0.m_data_utf8 = (char *)writer;
  QVar47.m_size = (size_t)local_f8.a.a.a.a.d.ptr;
  QVar47.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar27,QVar47);
  if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!hasBorder) goto LAB_005bd725;
  pcVar9 = (this->foNS).d.ptr;
  uVar1 = (this->foNS).d.size;
  QVar28.m_data = &DAT_00000006;
  QVar28.m_size = (qsizetype)&local_60;
  QString::fromLatin1(QVar28);
  qVar3 = QTextFormat::doubleProperty((QTextFormat *)tableFormatTmp,0x4000);
  pixelToPoint(&local_1a8,qVar3);
  qVar6 = local_1a8.d.size;
  pcVar13 = local_1a8.d.ptr;
  pDVar5 = local_1a8.d.d;
  local_1a8.d.d = (Data *)0x0;
  local_1a8.d.ptr = (char16_t *)0x0;
  local_1a8.d.size = 0;
  iVar8 = QTextFormat::intProperty((QTextFormat *)tableFormatTmp,0x4010);
  switch(iVar8) {
  case 0:
    psVar10 = (storage_type *)0x4;
    goto LAB_005bd453;
  case 1:
  case 6:
    break;
  case 2:
  case 5:
    break;
  case 3:
    goto LAB_005bd433;
  case 4:
    break;
  case 7:
    break;
  case 8:
    goto LAB_005bd433;
  case 9:
LAB_005bd433:
    psVar10 = &DAT_00000005;
    goto LAB_005bd453;
  case 10:
    break;
  default:
    psVar10 = (storage_type *)0x0;
    goto LAB_005bd453;
  }
  psVar10 = &DAT_00000006;
LAB_005bd453:
  QVar29.m_size = &local_1c8;
  QVar29.m_data = psVar10;
  QString::fromLatin1(QVar29);
  local_148.b.d.size = local_1b8;
  local_148.b.d.ptr = pcStack_1c0;
  local_148.b.d.d = (Data *)local_1c8;
  local_188.a.b.m_size = 1;
  local_188.a.b.m_data = " ";
  local_1b8 = 0;
  local_188.a.a.d.d = (Data *)0x0;
  local_188.a.a.d.ptr = (char16_t *)0x0;
  local_148.a.a.d.d = pDVar5;
  local_148.a.a.d.ptr = pcVar13;
  local_188.a.a.d.size = 0;
  local_148.a.a.d.size = qVar6;
  local_148.a.b.m_size = 1;
  local_148.a.b.m_data = " ";
  local_188.b.d.d = (Data *)0x0;
  local_188.b.d.ptr = (char16_t *)0x0;
  local_1c8 = (QArrayData *)0x0;
  pcStack_1c0 = (char16_t *)0x0;
  local_188.b.d.size = 0;
  local_108 = 1;
  pcStack_100 = " ";
  QTextFormat::brushProperty((QTextFormat *)local_1f0,(int)tableFormatTmp);
  QColor::name(&local_1e8,(QColor *)((long)local_1f0 + 8),HexRgb);
  local_f8.a.a.b.d.size = local_148.b.d.size;
  local_f8.a.a.b.d.ptr = local_148.b.d.ptr;
  local_f8.a.a.b.d.d = local_148.b.d.d;
  local_f8.a.a.a.a.d.size = local_148.a.a.d.size;
  local_f8.a.a.a.a.d.ptr = local_148.a.a.d.ptr;
  local_f8.a.a.a.a.d.d = local_148.a.a.d.d;
  local_f8.b.d.size = local_1e8.d.size;
  local_f8.b.d.ptr = local_1e8.d.ptr;
  local_f8.b.d.d = local_1e8.d.d;
  local_148.a.a.d.d = (Data *)0x0;
  local_148.a.a.d.ptr = (char16_t *)0x0;
  local_148.a.a.d.size = 0;
  local_f8.a.a.a.b.m_size = local_148.a.b.m_size;
  local_f8.a.a.a.b.m_data = local_148.a.b.m_data;
  local_148.b.d.d = (Data *)0x0;
  local_148.b.d.ptr = (char16_t *)0x0;
  local_148.b.d.size = 0;
  local_f8.a.b.m_size = local_108;
  local_f8.a.b.m_data = pcStack_100;
  local_1e8.d.d = (Data *)0x0;
  local_1e8.d.ptr = (char16_t *)0x0;
  local_1e8.d.size = 0;
  local_208.d.size = 0;
  local_208.d.d = (Data *)0x0;
  local_208.d.ptr = (char16_t *)0x0;
  QAnyStringView::
  QAnyStringView<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>,_true>
            (&local_90,&local_f8,&local_208);
  QVar30.m_size = (size_t)pcVar9;
  QVar30.field_0.m_data_utf8 = (char *)writer;
  QVar48.m_size = local_58;
  QVar48.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar57.m_size = sVar11;
  QVar57.field_0.m_data = (void *)(local_50 | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar30,QVar48,QVar57);
  if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_QLatin1String>,_QString>
  ::~QStringBuilder(&local_f8);
  if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QBrush::~QBrush((QBrush *)local_1f0);
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::~QStringBuilder(&local_148);
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::~QStringBuilder(&local_188);
  if (local_1c8 != (QArrayData *)0x0) {
    LOCK();
    (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1c8,2,0x10);
    }
  }
  if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,2,0x10);
    }
  }
LAB_005bd725:
  qVar3 = QTextFormat::doubleProperty((QTextFormat *)format,0x4812);
  qVar4 = QTextFormat::doubleProperty((QTextFormat *)tableFormatTmp,0x4103);
  pixels = qVar4 + qVar3;
  if (pixels <= 0.0) {
LAB_005bd92d:
    qVar3 = QTextFormat::doubleProperty((QTextFormat *)format,0x4813);
    qVar4 = QTextFormat::doubleProperty((QTextFormat *)tableFormatTmp,0x4103);
    if (0.0 < qVar4 + qVar3) {
      pcVar9 = (this->foNS).d.ptr;
      uVar1 = (this->foNS).d.size;
      QVar34.m_data = (storage_type *)0xe;
      QVar34.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar34);
      pcVar13 = local_f8.a.a.a.a.d.ptr;
      aVar12.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
      pixelToPoint((QString *)&local_148,qVar4 + qVar3);
      QVar35.m_size = (size_t)pcVar9;
      QVar35.field_0.m_data_utf8 = (char *)writer;
      QVar50.m_size = (size_t)pcVar13;
      QVar50.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
      QVar59.m_size = sVar11;
      QVar59.field_0.m_data = aVar12.m_data;
      QXmlStreamWriter::writeAttribute(QVar35,QVar50,QVar59);
      if (&(local_148.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_148.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    qVar3 = QTextFormat::doubleProperty((QTextFormat *)format,0x4814);
    qVar4 = QTextFormat::doubleProperty((QTextFormat *)tableFormatTmp,0x4103);
    if (0.0 < qVar4 + qVar3) {
      pcVar9 = (this->foNS).d.ptr;
      uVar1 = (this->foNS).d.size;
      QVar36.m_data = &DAT_0000000c;
      QVar36.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar36);
      pcVar13 = local_f8.a.a.a.a.d.ptr;
      aVar12.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
      pixelToPoint((QString *)&local_148,qVar4 + qVar3);
      QVar37.m_size = (size_t)pcVar9;
      QVar37.field_0.m_data_utf8 = (char *)writer;
      QVar51.m_size = (size_t)pcVar13;
      QVar51.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
      QVar60.m_size = sVar11;
      QVar60.field_0.m_data = aVar12.m_data;
      QXmlStreamWriter::writeAttribute(QVar37,QVar51,QVar60);
      if (&(local_148.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_148.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    qVar3 = QTextFormat::doubleProperty((QTextFormat *)format,0x4815);
    qVar4 = QTextFormat::doubleProperty((QTextFormat *)tableFormatTmp,0x4103);
    if (0.0 < qVar4 + qVar3) {
      pcVar9 = (this->foNS).d.ptr;
      uVar2 = (this->foNS).d.size;
      QVar38.m_data = (storage_type *)0xd;
      QVar38.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar38);
      uVar1 = local_f8.a.a.a.a.d.size;
      pcVar13 = local_f8.a.a.a.a.d.ptr;
      pixelToPoint((QString *)&local_148,qVar4 + qVar3);
      goto LAB_005bdc2e;
    }
  }
  else {
    qVar4 = QTextFormat::doubleProperty((QTextFormat *)format,0x4813);
    if ((qVar3 != qVar4) ||
       (qVar4 = QTextFormat::doubleProperty((QTextFormat *)format,0x4814), qVar3 != qVar4)) {
LAB_005bd839:
      pcVar9 = (this->foNS).d.ptr;
      uVar1 = (this->foNS).d.size;
      QVar32.m_data = (storage_type *)0xb;
      QVar32.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar32);
      pcVar13 = local_f8.a.a.a.a.d.ptr;
      aVar12.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
      pixelToPoint((QString *)&local_148,pixels);
      QVar33.m_size = (size_t)pcVar9;
      QVar33.field_0.m_data_utf8 = (char *)writer;
      QVar49.m_size = (size_t)pcVar13;
      QVar49.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
      QVar58.m_size = sVar11;
      QVar58.field_0.m_data = aVar12.m_data;
      QXmlStreamWriter::writeAttribute(QVar33,QVar49,QVar58);
      if (&(local_148.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_148.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_005bd92d;
    }
    qVar4 = QTextFormat::doubleProperty((QTextFormat *)format,0x4815);
    if ((qVar3 != qVar4) || (NAN(qVar3) || NAN(qVar4))) goto LAB_005bd839;
    pcVar9 = (this->foNS).d.ptr;
    uVar2 = (this->foNS).d.size;
    QVar31.m_data = (storage_type *)0x7;
    QVar31.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar31);
    uVar1 = local_f8.a.a.a.a.d.size;
    pcVar13 = local_f8.a.a.a.a.d.ptr;
    pixelToPoint((QString *)&local_148,pixels);
LAB_005bdc2e:
    QVar39.m_size = (size_t)pcVar9;
    QVar39.field_0.m_data_utf8 = (char *)writer;
    QVar52.m_size = (size_t)pcVar13;
    QVar52.field_0.m_data = (void *)(uVar2 | 0x8000000000000000);
    QVar61.m_size = sVar11;
    QVar61.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar39,QVar52,QVar61);
    if (&(local_148.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_148.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar7 = QTextFormat::hasProperty((QTextFormat *)format,0x2021);
  if (!bVar7) goto LAB_005bdddf;
  iVar8 = QTextFormat::intProperty((QTextFormat *)format,0x2021);
  if (iVar8 == 5) {
LAB_005bdcfd:
    psVar10 = &DAT_00000006;
  }
  else if (iVar8 == 4) {
    psVar10 = (storage_type *)0x3;
  }
  else {
    if (iVar8 == 3) goto LAB_005bdcfd;
    psVar10 = (storage_type *)0x9;
  }
  QVar40.m_data = psVar10;
  QVar40.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar40);
  pDVar5 = local_f8.a.a.a.a.d.d;
  pcVar9 = (this->styleNS).d.ptr;
  uVar1 = (this->styleNS).d.size;
  QVar41.m_data = (storage_type *)0xe;
  QVar41.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar41);
  QVar42.m_size = (size_t)pcVar9;
  QVar42.field_0.m_data_utf8 = (char *)writer;
  QVar53.m_size = (size_t)local_f8.a.a.a.a.d.ptr;
  QVar53.field_0.m_data = (void *)(uVar1 | 0x8000000000000000);
  QVar62.m_size = sVar11;
  QVar62.field_0.m_data = (void *)(local_f8.a.a.a.a.d.size | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar42,QVar53,QVar62);
  if (&(local_f8.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_f8.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_f8.a.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
    }
  }
LAB_005bdddf:
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::tableCellStyleElement(QXmlStreamWriter &writer, const int &formatIndex,
                                           const QTextTableCellFormat &format,
                                           bool hasBorder, int tableId,
                                           const QTextTableFormat tableFormatTmp) const {
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    if (hasBorder) {
        writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                              QString::fromLatin1("TB%1.%2").arg(tableId).arg(formatIndex));
    } else {
        writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("T%1").arg(formatIndex));
    }
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table-cell"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("table-cell-properties"));
    if (hasBorder) {
        writer.writeAttribute(foNS, QString::fromLatin1("border"),
                              pixelToPoint(tableFormatTmp.border()) + " "_L1
                              + borderStyleName(tableFormatTmp.borderStyle()) + " "_L1
                              + tableFormatTmp.borderBrush().color().name(QColor::HexRgb));
    }
    qreal topPadding = format.topPadding();
    qreal padding = topPadding + tableFormatTmp.cellPadding();
    if (padding > 0 && topPadding == format.bottomPadding()
        && topPadding == format.leftPadding() && topPadding == format.rightPadding()) {
        writer.writeAttribute(foNS, QString::fromLatin1("padding"), pixelToPoint(padding));
    }
    else {
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-top"), pixelToPoint(padding));
        padding = format.bottomPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-bottom"),
                                  pixelToPoint(padding));
        padding = format.leftPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-left"),
                                  pixelToPoint(padding));
        padding = format.rightPadding() + tableFormatTmp.cellPadding();
        if (padding > 0)
            writer.writeAttribute(foNS, QString::fromLatin1("padding-right"),
                                  pixelToPoint(padding));
    }

    if (format.hasProperty(QTextFormat::TextVerticalAlignment)) {
        QString pos;
        switch (format.verticalAlignment()) {  // TODO - review: doesn't handle all cases
        case QTextCharFormat::AlignMiddle:
            pos = QString::fromLatin1("middle"); break;
        case QTextCharFormat::AlignTop:
            pos = QString::fromLatin1("top"); break;
        case QTextCharFormat::AlignBottom:
            pos = QString::fromLatin1("bottom"); break;
        default:
            pos = QString::fromLatin1("automatic"); break;
        }
        writer.writeAttribute(styleNS, QString::fromLatin1("vertical-align"), pos);
    }

    // TODO
    // ODF just search for style-table-cell-properties-attlist)
    // QTextFormat::BackgroundImageUrl
    // format.background
    writer.writeEndElement(); // style
}